

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O1

bool __thiscall AllDiffBoundsImp<4>::filterlower(AllDiffBoundsImp<4> *this)

{
  interval *piVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  interval *piVar9;
  IntVar *pIVar10;
  bool bVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  int l_1;
  int iVar17;
  long lVar18;
  int l;
  int iVar19;
  ulong uVar20;
  int iVar22;
  long lVar23;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  bool bVar24;
  int local_94;
  anon_union_8_2_743a5d44_for_Reason_0 local_80;
  long local_78;
  int local_6c;
  int local_68;
  int local_64;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  ulong uVar21;
  
  if (-1 < this->nb) {
    piVar4 = this->bounds;
    piVar5 = this->t;
    piVar6 = this->h;
    piVar7 = this->d;
    piVar8 = this->bucket;
    lVar23 = 0;
    do {
      iVar2 = piVar4[lVar23 + 1];
      piVar6[lVar23 + 1] = (int)lVar23;
      piVar5[lVar23 + 1] = (int)lVar23;
      piVar7[lVar23 + 1] = iVar2 - piVar4[lVar23];
      piVar8[lVar23 + 1] = -1;
      lVar23 = lVar23 + 1;
    } while (lVar23 <= this->nb);
  }
  if (0 < this->sz) {
    lVar23 = 0;
    bVar24 = true;
    do {
      piVar9 = this->iv;
      piVar4 = this->maxsorted;
      piVar1 = piVar9 + piVar4[lVar23];
      local_68 = piVar1->minrank;
      iVar2 = piVar1->maxrank;
      local_50 = (long)iVar2;
      piVar5 = this->t;
      iVar19 = local_68 + 1;
      iVar3 = iVar19;
      do {
        local_94 = iVar3;
        iVar3 = piVar5[local_94];
      } while (local_94 < iVar3);
      piVar6 = this->bucket;
      piVar1->next = piVar6[local_94];
      piVar6[local_94] = piVar4[lVar23];
      piVar4 = this->d + local_94;
      *piVar4 = *piVar4 + -1;
      if (*piVar4 == 0) {
        piVar5[local_94] = local_94 + 1;
        iVar22 = local_94 + 1;
        do {
          local_94 = iVar22;
          iVar22 = piVar5[local_94];
        } while (local_94 < piVar5[local_94]);
        piVar5[local_94] = iVar3;
      }
      while (iVar19 != local_94) {
        iVar22 = piVar5[iVar19];
        piVar5[iVar19] = local_94;
        iVar19 = iVar22;
      }
      iVar19 = this->h[local_68];
      if (local_68 < iVar19) {
        piVar4 = this->bounds;
        do {
          iVar22 = iVar19;
          lVar18 = (long)iVar22;
          iVar19 = this->h[lVar18];
        } while (iVar22 < iVar19);
        iVar19 = piVar4[lVar18];
        if (so.lazy == true) {
          iVar15 = piVar4[local_68];
          lVar16 = lVar18;
          if (iVar15 < piVar4[lVar18]) {
            do {
              uVar13 = piVar6[lVar16];
              while (-1 < (int)uVar13) {
                uVar20 = (ulong)uVar13;
                uVar21 = (ulong)uVar13;
                uVar13 = piVar9[uVar20].next;
                if (piVar9[uVar21].min < iVar15) {
                  iVar15 = piVar9[uVar21].min;
                }
              }
              lVar12 = lVar16 + -1;
              lVar16 = lVar16 + -1;
            } while (iVar15 < piVar4[lVar12]);
          }
          local_78 = lVar18;
          local_60 = (long)iVar19;
          local_80._pt = (Clause *)malloc((long)((iVar19 - iVar15) * 2) * 4 + 0x14);
          *(uint *)local_80._pt = (*(uint *)local_80._pt & 0xfc) + (iVar19 - iVar15) * 0x200 + 0x302
          ;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_80._pt);
          r = local_80;
          local_40 = (long)iVar15;
          pIVar10 = this->x[this->maxsorted[lVar23]].var;
          uVar13 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xd])
                             (pIVar10,local_40 - this->x[this->maxsorted[lVar23]].b,2);
          if (*(uint *)r._pt < 0x200) goto LAB_00158c9d;
          *(uint *)(r._a + 8) = uVar13 ^ 1;
          lVar18 = local_60;
          if (iVar15 < this->bounds[iVar22]) {
            local_48 = local_60 + -1;
            iVar17 = 3;
            lVar16 = local_78;
            local_6c = iVar19;
            local_64 = iVar15;
            local_58 = lVar23;
            do {
              uVar13 = this->bucket[lVar16];
              local_78 = lVar16;
              if (-1 < (int)uVar13) {
                lVar23 = (long)iVar17 + 1;
                do {
                  local_38 = lVar23 + -1;
                  pIVar10 = this->x[uVar13].var;
                  uVar14 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xd])
                                     (pIVar10,local_40 - this->x[uVar13].b,2);
                  if ((long)(ulong)(*(uint *)r._pt >> 8) <= local_38) goto LAB_00158c9d;
                  (r._pt)->data[lVar23 + -1].x = uVar14 ^ 1;
                  pIVar10 = this->x[uVar13].var;
                  uVar14 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xd])
                                     (pIVar10,local_48 - this->x[uVar13].b,3);
                  if ((long)(ulong)(*(uint *)r._pt >> 8) <= lVar23) goto LAB_00158c9d;
                  (r._pt)->data[lVar23].x = uVar14 ^ 1;
                  uVar13 = this->iv[uVar13].next;
                  lVar23 = lVar23 + 2;
                  iVar17 = iVar17 + 2;
                } while (-1 < (int)uVar13);
              }
              lVar16 = local_78 + -1;
              lVar18 = local_60;
              lVar23 = local_58;
              iVar19 = local_6c;
            } while (local_64 < this->bounds[local_78 + -1]);
          }
        }
        else {
          r._pt = (Clause *)0x0;
          lVar18 = (long)iVar19;
        }
        uVar13 = (this->b).v;
        if (sat.assigns.data[uVar13] == 0) {
          pIVar10 = this->x[this->maxsorted[lVar23]].var;
          lVar16 = (long)this->x[this->maxsorted[lVar23]].b;
          bVar11 = true;
          if ((pIVar10->max).v + lVar16 < lVar18) {
            iVar19 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xd])
                               (pIVar10,lVar18 - lVar16,2);
            if (*(uint *)r < 0x300) goto LAB_00158c9d;
            *(int *)((long)r + 0xc) = iVar19;
            SAT::cEnqueue(&sat,(Lit)(((this->b).s ^ 1) + (this->b).v * 2),(Reason)r);
            bVar24 = sat.confl == (Clause *)0x0;
            bVar11 = false;
          }
        }
        else {
          if (*(uint *)r < 0x300) {
LAB_00158c9d:
            abort();
          }
          *(uint *)((long)r + 0xc) = (uint)((byte)sat.assigns.data[uVar13] < 0xfe) + uVar13 * 2;
          pIVar10 = this->x[this->maxsorted[lVar23]].var;
          iVar15 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xe])
                             (pIVar10,lVar18 - this->x[this->maxsorted[lVar23]].b,r,1);
          if ((char)iVar15 == '\0') {
            bVar11 = false;
            bVar24 = false;
          }
          else {
            piVar4 = this->maxsorted;
            this->iv[piVar4[lVar23]].min = iVar19;
            iVar19 = piVar4[lVar23];
            if ((lVar18 < (long)this->x[iVar19].b + (long)((this->x[iVar19].var)->min).v) &&
               ((this->super_Propagator).in_queue == false)) {
              (this->super_Propagator).in_queue = true;
              local_80 = (anon_union_8_2_743a5d44_for_Reason_0)this;
              vec<Propagator_*>::push
                        (engine.p_queue.data + (uint)(this->super_Propagator).priority,
                         (Propagator **)&local_80._pt);
            }
            bVar11 = true;
            if (local_68 != iVar22) {
              piVar4 = this->h;
              do {
                iVar19 = piVar4[local_68];
                piVar4[local_68] = iVar22;
                local_68 = iVar19;
              } while (iVar19 != iVar22);
            }
          }
        }
        if (bVar11) goto LAB_00158c2d;
        bVar11 = false;
      }
      else {
LAB_00158c2d:
        bVar11 = true;
        if (this->d[local_94] == this->bounds[local_94] - this->bounds[local_50]) {
          piVar4 = this->h;
          iVar19 = piVar4[local_50];
          while (iVar19 != iVar3 + -1) {
            iVar22 = piVar4[iVar19];
            piVar4[iVar19] = iVar2;
            iVar19 = iVar22;
          }
          piVar4[local_50] = iVar3 + -1;
        }
      }
      if (!bVar11) {
        return bVar24;
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < this->sz);
  }
  return true;
}

Assistant:

bool filterlower() {
		int i;
		int j;
		int w;
		int z;

		// fprintf(stderr, "AllDiffBounds::filterlower()\n");
		for (i = 1; i <= nb + 1; i++) {
			d[i] = bounds[i] - bounds[t[i] = h[i] = i - 1];
			bucket[i] = -1;  // this could perhaps be avoided
		}
		for (i = 0; i < sz; i++) {  // visit intervals in increasing max order
			const int minrank = iv[maxsorted[i]].minrank;
			const int maxrank = iv[maxsorted[i]].maxrank;
			// fprintf(stderr, "var %d [%d, %d)\n", maxsorted[i], bounds[minrank], bounds[maxrank]);
			j = t[z = pathmax(t, minrank + 1)];
			iv[maxsorted[i]].next = bucket[z];
			bucket[z] = maxsorted[i];
			if (--d[z] == 0) {
				t[z = pathmax(t, t[z] = z + 1)] = j;
			}
			pathset(t, minrank + 1, z, z);  // path compression
			// if (d[z] < bounds[z]-bounds[maxrank]) return false; // no solution
			if (h[minrank] > minrank) {
				Clause* r = nullptr;
				const int hall_max = bounds[w = pathmax(h, h[minrank])];
				if (so.lazy) {
					int hall_min = bounds[minrank];
					// here both k and hall_min are decreasing, stop when k catches up
					for (int k = w; bounds[k] > hall_min; --k) {
						for (int l = bucket[k]; l >= 0; l = iv[l].next) {
							hall_min = std::min(hall_min, iv[l].min);
						}
					}
					// fprintf(stderr, "  in hall [%d, %d):\n", hall_min, hall_max);
					r = Reason_new(3 + (hall_max - hall_min) * 2);
					(*r)[1] = ~x[maxsorted[i]].getLit(hall_min, LR_GE);
					int m = 3;
					for (int k = w; bounds[k] > hall_min; --k) {
						for (int l = bucket[k]; l >= 0; l = iv[l].next) {
							// fprintf(stderr, "    var %d [%d, %d)\n", l, iv[l].min, iv[l].max);
							(*r)[m++] = ~x[l].getLit(hall_min, LR_GE);
							(*r)[m++] = ~x[l].getLit(hall_max - 1, LR_LE);
						}
					}
					assert(m == 3 + (hall_max - hall_min) * 2);
				}
				if (b.isFixed()) {
					assert(b.isTrue());
					(*r)[2] = b.getValLit();
					if (!x[maxsorted[i]].setMin(hall_max, r)) {
						// fprintf(stderr, "  failure\n");
						return false;
					}
					iv[maxsorted[i]].min = hall_max;
					if (x[maxsorted[i]].getMin() > hall_max) {
						// fprintf(stderr, "  hole, var %d [%d, %d)\n", maxsorted[i],
						// static_cast<int>(x[maxsorted[i]].getMin()), iv[maxsorted[i]].max);
						pushInQueue();  // hole in domain
					}
					pathset(h, minrank, w, w);  // path compression
				} else {
					if (x[maxsorted[i]].getMax() < hall_max) {
						(*r)[2] = x[maxsorted[i]].getLit(hall_max, LR_GE);
						return b.setVal(false, r);
					}
				}
			}
			if (d[z] == bounds[z] - bounds[maxrank]) {
				// fprintf(stderr, "  new hall [%d, %d)\n", bounds[j], bounds[maxrank]);
				pathset(h, h[maxrank], j - 1, maxrank);  // mark hall interval
				h[maxrank] = j - 1;
			}
		}
		return true;
	}